

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.c
# Opt level: O1

int vorbis_synthesis_trackonly(vorbis_block *vb,ogg_packet *op)

{
  oggpack_buffer *b;
  void *pvVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  pvVar1 = vb->vd->backend_state;
  pvVar2 = vb->vd->vi->codec_setup;
  b = &vb->opb;
  _vorbis_block_ripcord(vb);
  oggpack_readinit(b,op->packet,(int)op->bytes);
  lVar5 = oggpack_read(b,1);
  iVar6 = -0x87;
  if (lVar5 == 0) {
    lVar5 = oggpack_read(b,*(int *)((long)pvVar1 + 0x50));
    iVar6 = -0x88;
    iVar4 = (int)lVar5;
    if (iVar4 != -1) {
      vb->mode = iVar4;
      piVar3 = *(int **)((long)pvVar2 + (long)iVar4 * 8 + 0x28);
      if (piVar3 != (int *)0x0) {
        lVar5 = (long)*piVar3;
        vb->W = lVar5;
        if (lVar5 == 0) {
          vb->lW = 0;
          vb->nW = 0;
        }
        else {
          lVar5 = oggpack_read(b,1);
          vb->lW = lVar5;
          lVar5 = oggpack_read(b,1);
          vb->nW = lVar5;
          if (lVar5 == -1) {
            return -0x88;
          }
        }
        vb->granulepos = op->granulepos;
        vb->sequence = op->packetno;
        vb->eofflag = (int)op->e_o_s;
        vb->pcmend = 0;
        vb->pcm = (float **)0x0;
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

int vorbis_synthesis_trackonly(vorbis_block *vb,ogg_packet *op){
  vorbis_dsp_state     *vd=vb->vd;
  private_state        *b=vd->backend_state;
  vorbis_info          *vi=vd->vi;
  codec_setup_info     *ci=vi->codec_setup;
  oggpack_buffer       *opb=&vb->opb;
  int                   mode;

  /* first things first.  Make sure decode is ready */
  _vorbis_block_ripcord(vb);
  oggpack_readinit(opb,op->packet,op->bytes);

  /* Check the packet type */
  if(oggpack_read(opb,1)!=0){
    /* Oops.  This is not an audio data packet */
    return(OV_ENOTAUDIO);
  }

  /* read our mode and pre/post windowsize */
  mode=oggpack_read(opb,b->modebits);
  if(mode==-1)return(OV_EBADPACKET);

  vb->mode=mode;
  if(!ci->mode_param[mode]){
    return(OV_EBADPACKET);
  }

  vb->W=ci->mode_param[mode]->blockflag;
  if(vb->W){
    vb->lW=oggpack_read(opb,1);
    vb->nW=oggpack_read(opb,1);
    if(vb->nW==-1)   return(OV_EBADPACKET);
  }else{
    vb->lW=0;
    vb->nW=0;
  }

  /* more setup */
  vb->granulepos=op->granulepos;
  vb->sequence=op->packetno;
  vb->eofflag=op->e_o_s;

  /* no pcm */
  vb->pcmend=0;
  vb->pcm=NULL;

  return(0);
}